

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O2

void __thiscall
Apple::Macintosh::Audio::apply_samples<(Outputs::Speaker::Action)0>
          (Audio *this,size_t number_of_samples,MonoSample *target)

{
  byte bVar1;
  short sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  short __tmp;
  ulong uVar6;
  long lVar7;
  
  for (; number_of_samples != 0; number_of_samples = number_of_samples - uVar6) {
    sVar3 = this->subcycle_offset_;
    uVar6 = 0xb0 - sVar3;
    if (number_of_samples <= uVar6) {
      uVar6 = number_of_samples;
    }
    sVar4 = (this->sample_queue_).read_pointer;
    bVar1 = (this->sample_queue_).buffer._M_elems[sVar4].super___atomic_base<unsigned_char>._M_i;
    sVar2 = this->volume_multiplier_;
    for (lVar7 = 0; uVar6 * 2 != lVar7; lVar7 = lVar7 + 2) {
      *(ushort *)((long)target + lVar7) = (bVar1 - 0x80) * sVar2;
    }
    uVar5 = sVar3 + uVar6;
    (this->sample_queue_).read_pointer = (uVar5 / 0xb0 + sVar4) % 0x2e4;
    this->subcycle_offset_ = uVar5 % 0xb0;
    target = target + uVar6;
  }
  return;
}

Assistant:

void Audio::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	// TODO: the implementation below acts as if the hardware uses pulse-amplitude modulation;
	// in fact it uses pulse-width modulation. But the scale for pulses isn't specified, so
	// that's something to return to.

	while(number_of_samples) {
		// Determine how many output samples will be at the same level.
		const auto cycles_left_in_sample = std::min(number_of_samples, sample_length - subcycle_offset_);

		// Determine the output level, and output that many samples.
		const int16_t output_level = volume_multiplier_ * (int16_t(sample_queue_.buffer[sample_queue_.read_pointer].load(std::memory_order::memory_order_relaxed)) - 128);
		Outputs::Speaker::fill<action>(target, target + cycles_left_in_sample, output_level);
		target += cycles_left_in_sample;

		// Advance the sample pointer.
		subcycle_offset_ += cycles_left_in_sample;
		sample_queue_.read_pointer = (sample_queue_.read_pointer + (subcycle_offset_ / sample_length)) % sample_queue_.buffer.size();
		subcycle_offset_ %= sample_length;

		// Decreate the number of samples left to write.
		number_of_samples -= cycles_left_in_sample;
	}
}